

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Runtime::SetProperty(Runtime *this,RuntimeID id,function<bool_(Jinx::Variant_&)> *fn)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  RuntimeID local_28;
  
  local_28 = id;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pmVar3 = std::
           map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
           ::operator[](&this->m_propertyMap,&local_28);
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar1 = (*fn->_M_invoker)((_Any_data *)fn,pmVar3);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline_t bool Runtime::SetProperty(RuntimeID id, std::function<bool(Variant &)> fn)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto& prop = m_propertyMap[id];
		return fn(prop);
	}